

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::OptionBase<CLI::Option>::group(OptionBase<CLI::Option> *this,string *name)

{
  bool bVar1;
  IncorrectConstruction *this_00;
  allocator local_39;
  string local_38;
  string *local_18;
  string *name_local;
  OptionBase<CLI::Option> *this_local;
  
  local_18 = name;
  name_local = &this->group_;
  bVar1 = detail::valid_alias_name_string(name);
  if (!bVar1) {
    this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_38,"Group names may not contain newlines or null characters",
               &local_39);
    IncorrectConstruction::IncorrectConstruction(this_00,&local_38);
    __cxa_throw(this_00,&IncorrectConstruction::typeinfo,
                IncorrectConstruction::~IncorrectConstruction);
  }
  ::std::__cxx11::string::operator=((string *)this,(string *)local_18);
  return (Option *)this;
}

Assistant:

CRTP *group(const std::string &name) {
        if(!detail::valid_alias_name_string(name)) {
            throw IncorrectConstruction("Group names may not contain newlines or null characters");
        }
        group_ = name;
        return static_cast<CRTP *>(this);
    }